

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

jpc_ms_t * jpc_ms_create(int type)

{
  jpc_mstabent_t *pjVar1;
  jpc_mstabent_t *mstabent;
  jpc_ms_t *ms;
  jpc_ms_t *pjStack_10;
  int type_local;
  
  pjStack_10 = (jpc_ms_t *)jas_malloc(0x88);
  if (pjStack_10 == (jpc_ms_t *)0x0) {
    pjStack_10 = (jpc_ms_t *)0x0;
  }
  else {
    pjStack_10->id = (long)type;
    pjStack_10->len = 0;
    pjVar1 = jpc_mstab_lookup((int)pjStack_10->id);
    pjStack_10->ops = &pjVar1->ops;
    memset(&pjStack_10->parms,0,0x68);
  }
  return pjStack_10;
}

Assistant:

jpc_ms_t *jpc_ms_create(int type)
{
	jpc_ms_t *ms;
	const jpc_mstabent_t *mstabent;

	if (!(ms = jas_malloc(sizeof(jpc_ms_t)))) {
		return 0;
	}
	ms->id = type;
	ms->len = 0;
	mstabent = jpc_mstab_lookup(ms->id);
	ms->ops = &mstabent->ops;
	memset(&ms->parms, 0, sizeof(jpc_msparms_t));
	return ms;
}